

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemoryRegionSection * phys_page_find(AddressSpaceDispatch *d,hwaddr addr)

{
  PhysPageEntry PVar1;
  _Bool _Var2;
  PhysPageEntry *pPVar3;
  MemoryRegionSection *pMVar4;
  int iVar5;
  MemoryRegionSection *section;
  
  pPVar3 = &d->phys_map;
  pMVar4 = (d->map).sections;
  iVar5 = 6;
  while( true ) {
    PVar1 = *pPVar3;
    if ((((uint)PVar1 & 0x3f) == 0) || (iVar5 = iVar5 - ((uint)PVar1 & 0x3f), iVar5 < 0)) break;
    if ((uint)PVar1 >> 6 == 0x3ffffff) {
      return pMVar4;
    }
    pPVar3 = (d->map).nodes[(uint)PVar1 >> 6] +
             ((uint)((addr >> 0xe) >> ((char)iVar5 * '\t' & 0x3fU)) & 0x1ff);
  }
  section = (MemoryRegionSection *)((long)&pMVar4->size + (ulong)((uint)PVar1 & 0xffffffc0));
  _Var2 = section_covers_addr(section,addr);
  if (_Var2) {
    pMVar4 = section;
  }
  return pMVar4;
}

Assistant:

static MemoryRegionSection *phys_page_find(AddressSpaceDispatch *d, hwaddr addr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = d->uc;
#endif
    PhysPageEntry lp = d->phys_map, *p;
    Node *nodes = d->map.nodes;
    MemoryRegionSection *sections = d->map.sections;
    hwaddr index = addr >> TARGET_PAGE_BITS;
    int i;

    for (i = P_L2_LEVELS; lp.skip && (i -= lp.skip) >= 0;) {
        if (lp.ptr == PHYS_MAP_NODE_NIL) {
            return &sections[PHYS_SECTION_UNASSIGNED];
        }
        p = nodes[lp.ptr];
        lp = p[(index >> (i * P_L2_BITS)) & (P_L2_SIZE - 1)];
    }

    if (section_covers_addr(&sections[lp.ptr], addr)) {
        return &sections[lp.ptr];
    } else {
        return &sections[PHYS_SECTION_UNASSIGNED];
    }
}